

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  bool bVar4;
  Limit limit;
  int iVar5;
  uint32 first_byte_or_zero;
  int64 iVar6;
  ulong uVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int value;
  ulong unaff_R13;
  bool bVar13;
  uint32 tag;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    uVar10 = (uint)*pbVar2;
    if (-1 < (char)*pbVar2) {
      input->buffer_ = pbVar2 + 1;
      bVar13 = true;
      goto LAB_0033487e;
    }
  }
  else {
    uVar10 = 0;
  }
  iVar6 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
  uVar10 = (uint)iVar6;
  bVar13 = -1 < iVar6;
LAB_0033487e:
  if (bVar13) {
    limit = io::CodedInputStream::PushLimit(input,uVar10);
    uVar10 = field_number << 3;
    do {
      iVar5 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar5 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar7 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003348c3;
        input->buffer_ = pbVar2 + 1;
        bVar13 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_003348c3:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar13 = -1 < (long)uVar7;
      }
      uVar3 = unaff_R13;
      if (bVar13) {
        uVar3 = uVar7;
      }
      unaff_R13 = uVar3 & 0xffffffff;
      if (!bVar13) {
        return false;
      }
      uVar12 = (uint)uVar3;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar4 = (*is_valid)(uVar12), bVar4)) {
        if (values->current_size_ == values->total_size_) {
          RepeatedField<int>::Reserve(values,values->total_size_ + 1);
        }
        iVar5 = values->current_size_;
        values->current_size_ = iVar5 + 1;
        values->rep_->elements[iVar5] = uVar12;
      }
      else {
        if (unknown_fields_stream->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(unknown_fields_stream,uVar10);
        }
        else {
          pbVar2 = unknown_fields_stream->buffer_;
          pbVar8 = pbVar2;
          uVar9 = uVar10;
          uVar11 = uVar10;
          if (0x7f < uVar10) {
            do {
              *pbVar8 = (byte)uVar11 | 0x80;
              uVar9 = uVar11 >> 7;
              pbVar8 = pbVar8 + 1;
              bVar4 = 0x3fff < uVar11;
              uVar11 = uVar9;
            } while (bVar4);
          }
          *pbVar8 = (byte)uVar9;
          iVar5 = ((int)pbVar8 - (int)pbVar2) + 1;
          unknown_fields_stream->buffer_ = unknown_fields_stream->buffer_ + iVar5;
          unknown_fields_stream->buffer_size_ = unknown_fields_stream->buffer_size_ - iVar5;
        }
        if (unknown_fields_stream->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(unknown_fields_stream,uVar12);
        }
        else {
          pbVar2 = unknown_fields_stream->buffer_;
          pbVar8 = pbVar2;
          uVar7 = unaff_R13;
          if (0x7f < uVar12) {
            uVar7 = uVar3 & 0xffffffff;
            do {
              uVar12 = (uint)uVar7;
              *pbVar8 = (byte)uVar7 | 0x80;
              uVar7 = uVar7 >> 7;
              pbVar8 = pbVar8 + 1;
            } while (0x3fff < uVar12);
          }
          *pbVar8 = (byte)uVar7;
          iVar5 = ((int)pbVar8 - (int)pbVar2) + 1;
          unknown_fields_stream->buffer_ = unknown_fields_stream->buffer_ + iVar5;
          unknown_fields_stream->buffer_size_ = unknown_fields_stream->buffer_size_ - iVar5;
        }
      }
    } while (bVar13);
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input,
    int field_number,
    bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream,
    RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}